

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void hashkey(connectdata *conn,char *buf,size_t len,char **hostp)

{
  uint uVar1;
  long lVar2;
  char **ppcVar3;
  
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar1 & 0x8040) == 0x40) {
    lVar2 = conn->port;
    ppcVar3 = &(conn->http_proxy).host.name;
  }
  else {
    lVar2 = (long)conn->remote_port;
    if ((uVar1 & 8) == 0) {
      ppcVar3 = &(conn->host).name;
    }
    else {
      ppcVar3 = &(conn->conn_to_host).name;
    }
  }
  if (len != 0) {
    *(char **)len = *ppcVar3;
  }
  curl_msnprintf(buf,0x80,"%ld%s",lVar2);
  return;
}

Assistant:

static void hashkey(struct connectdata *conn, char *buf,
                    size_t len,  /* something like 128 is fine */
                    const char **hostp)
{
  const char *hostname;
  long port = conn->remote_port;

  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    hostname = conn->http_proxy.host.name;
    port = conn->port;
  }
  else if(conn->bits.conn_to_host)
    hostname = conn->conn_to_host.name;
  else
    hostname = conn->host.name;

  if(hostp)
    /* report back which name we used */
    *hostp = hostname;

  /* put the number first so that the hostname gets cut off if too long */
  msnprintf(buf, len, "%ld%s", port, hostname);
}